

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cleanup_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::CFGCleanupPass::Process(CFGCleanupPass *this)

{
  bool bVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/cfg_cleanup_pass.cpp:28:25)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/cfg_cleanup_pass.cpp:28:25)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  bVar1 = IRContext::ProcessReachableCallTree
                    ((this->super_MemPass).super_Pass.context_,(ProcessFunction *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return bVar1 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status CFGCleanupPass::Process() {
  // Process all entry point functions.
  ProcessFunction pfn = [this](Function* fp) { return CFGCleanup(fp); };
  bool modified = context()->ProcessReachableCallTree(pfn);
  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}